

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,int>>::emplace<std::pair<QModelIndex,int>const&>
          (QMovableArrayOps<std::pair<QModelIndex,_int>_> *this,qsizetype i,
          pair<QModelIndex,_int> *args)

{
  undefined8 uVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  pair<QModelIndex,_int> *ppVar5;
  undefined8 *in_RDX;
  QArrayDataPointer<std::pair<QModelIndex,_int>_> *in_RSI;
  QArrayDataPointer<std::pair<QModelIndex,_int>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QModelIndex,_int> tmp;
  pair<QModelIndex,_int> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar7;
  undefined2 in_stack_ffffffffffffff94;
  byte bVar8;
  Inserter local_50;
  undefined8 local_28;
  quintptr local_20;
  QAbstractItemModel *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar2) {
    if ((in_RSI == (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::freeSpaceAtEnd(in_RDI), qVar4 != 0)
       ) {
      ppVar5 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::end
                         ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      uVar1 = *in_RDX;
      (ppVar5->first).r = (int)uVar1;
      (ppVar5->first).c = (int)((ulong)uVar1 >> 0x20);
      (ppVar5->first).i = in_RDX[1];
      (ppVar5->first).m.ptr = (QAbstractItemModel *)in_RDX[2];
      *(undefined8 *)&ppVar5->second = in_RDX[3];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0090a1d8;
    }
    if ((in_RSI == (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0) &&
       (qVar4 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::freeSpaceAtBegin(in_RDI),
       qVar4 != 0)) {
      ppVar5 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::begin
                         ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x90a053);
      uVar1 = *in_RDX;
      ppVar5[-1].first.r = (int)uVar1;
      ppVar5[-1].first.c = (int)((ulong)uVar1 >> 0x20);
      ppVar5[-1].first.i = in_RDX[1];
      ppVar5[-1].first.m.ptr = (QAbstractItemModel *)in_RDX[2];
      *(undefined8 *)&ppVar5[-1].second = in_RDX[3];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0090a1d8;
    }
  }
  local_28 = *in_RDX;
  local_20 = in_RDX[1];
  local_18 = (QAbstractItemModel *)in_RDX[2];
  local_10 = in_RDX[3];
  bVar6 = in_RDI->size != 0;
  uVar7 = bVar6 && in_RSI == (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0;
  uVar3 = (uint)(bVar6 && in_RSI == (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0);
  bVar8 = uVar7;
  QArrayDataPointer<std::pair<QModelIndex,_int>_>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(uVar2,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffff94,uVar3))),
             (pair<QModelIndex,_int> **)in_RDI,
             (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)
             CONCAT17(uVar7,in_stack_ffffffffffffff80));
  if ((bVar8 & 1) == 0) {
    QMovableArrayOps<std::pair<QModelIndex,_int>_>::Inserter::Inserter
              ((Inserter *)CONCAT17(uVar2,CONCAT16(bVar8,CONCAT24(in_stack_ffffffffffffff94,uVar3)))
               ,in_RDI,CONCAT17(uVar7,in_stack_ffffffffffffff80),
               (qsizetype)in_stack_ffffffffffffff78);
    QMovableArrayOps<std::pair<QModelIndex,_int>_>::Inserter::insertOne
              ((Inserter *)CONCAT17(uVar7,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    QMovableArrayOps<std::pair<QModelIndex,_int>_>::Inserter::~Inserter(&local_50);
  }
  else {
    ppVar5 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::begin
                       ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x90a160);
    ppVar5[-1].first.r = (undefined4)local_28;
    ppVar5[-1].first.c = local_28._4_4_;
    ppVar5[-1].first.i = local_20;
    ppVar5[-1].first.m.ptr = local_18;
    *(undefined8 *)&ppVar5[-1].second = local_10;
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
LAB_0090a1d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }